

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O1

bool __thiscall ON_SubDHeap::ReturnMeshFragment(ON_SubDHeap *this,ON_SubDMeshFragment *fragment)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  byte bVar5;
  ON_SleepLockGuard guard;
  ON_SleepLockGuard OStack_38;
  
  if (fragment == (ON_SubDMeshFragment *)0x0) {
    return false;
  }
  uVar1 = ON_SubDMeshFragment::VertexCapacity(fragment);
  if ((int)uVar1 < 0x51) {
    if (uVar1 == 4) {
      bVar5 = 0;
      uVar4 = 0;
      goto LAB_0062093b;
    }
    if (uVar1 == 9) {
      uVar4 = 1;
    }
    else {
      if (uVar1 != 0x19) goto LAB_00620917;
      uVar4 = 2;
    }
  }
  else if ((int)uVar1 < 0x441) {
    if (uVar1 == 0x51) {
      uVar4 = 3;
    }
    else {
      if (uVar1 != 0x121) {
LAB_00620917:
        uVar4 = 7;
        bVar5 = 1;
        goto LAB_0062093b;
      }
      uVar4 = 4;
    }
  }
  else if (uVar1 == 0x441) {
    uVar4 = 5;
  }
  else {
    if (uVar1 != 0x1081) goto LAB_00620917;
    uVar4 = 6;
  }
  bVar5 = 0;
LAB_0062093b:
  if (bVar5 == 0) {
    lVar2 = 600;
    if ((int)uVar4 + 1U == this->m_full_fragment_display_density) {
      lVar2 = 0x210;
    }
    lVar3 = 0x1c8;
    if (uVar4 != this->m_full_fragment_display_density) {
      lVar3 = lVar2;
    }
    ON_SleepLockGuard::ON_SleepLockGuard(&OStack_38,(ON_FixedSizePool *)((long)&this->m_ws + lVar3))
    ;
    fragment->m_face_vertex_index[2] = 0;
    fragment->m_face_vertex_index[3] = 0;
    fragment->m_reserved = (ON__UINT64)this->m_unused_fragments[uVar4];
    this->m_unused_fragments[uVar4] = (ON_FixedSizePoolElement *)fragment;
    ON_SleepLockGuard::~ON_SleepLockGuard(&OStack_38);
  }
  else {
    ON_SubDIncrementErrorCount();
  }
  return (bool)(bVar5 ^ 1);
}

Assistant:

bool ON_SubDHeap::ReturnMeshFragment(ON_SubDMeshFragment * fragment)
{
  if (nullptr == fragment)
    return false;

  const size_t count = sizeof(m_unused_fragments) / sizeof(m_unused_fragments[0]);
  size_t i;
  switch (fragment->VertexCapacity())
  {
  case 2 * 2: // 1x1 mesh quad fragment
    i = 0;
    break;
  case 3 * 3: // 2x2 mesh quad fragment
    i = 1;
    break;
  case 5 * 5: // 4x4 mesh quad fragment
    i = 2;
    break;
  case 9 * 9: // 8x8 mesh quad fragment
    i = 3;
    break;
  case 17 * 17: // 16x16 mesh quad fragment
    i = 4;
    break;
  case 33 * 33: // 32x32 mesh quad fragment
    i = 5;
    break;
  case 65 * 65: // 64x64 mesh quad fragment
    i = 6;
    break;
  default:
    i = count;
    break;
  }
  if (i >= count)
    return ON_SUBD_RETURN_ERROR(false);

  ON_FixedSizePool& fsp 
    = (i == m_full_fragment_display_density) ? m_fsp_full_fragments
    : (i+1 == m_full_fragment_display_density) ? m_fsp_part_fragments : m_fsp_oddball_fragments;

  ON_FixedSizePoolElement* ele = (ON_FixedSizePoolElement*)fragment;
  ON_SleepLockGuard guard(fsp);
  ((unsigned int*)ele)[5] = 0; // zero m_vertex_count_etc and m_vertex_capacity_etc
  ele->m_next = m_unused_fragments[i];
  m_unused_fragments[i] = ele;

  return true;
}